

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
OneLevel_InsertFourthNode_Test::OneLevel_InsertFourthNode_Test(OneLevel_InsertFourthNode_Test *this)

{
  OneLevel_InsertFourthNode_Test *this_local;
  
  anon_unknown.dwarf_10ddcf::OneLevel::OneLevel(&this->super_OneLevel);
  (this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__OneLevel_InsertFourthNode_Test_003d0828;
  return;
}

Assistant:

TEST_F (OneLevel, InsertFourthNode) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "a");
    this->insert_or_assign (*index_, t1, "b");
    this->insert_or_assign (*index_, t1, "c");

    // The node "d" is inserted into the internal heap node.
    std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "d");
    std::string const & key = (*itp.first).first;
    EXPECT_EQ ("d", key);
    EXPECT_TRUE (itp.second);
    EXPECT_EQ (4U, index_->size ());
    EXPECT_TRUE (this->is_found (*index_, "d")) << "key \"d\" should be present in the index";
    {
        // Check that the trie was laid out as we expected.
        index_pointer root = index_->root ();
        this->check_is_heap_internal_node (root);
        internal_node const * const root_internal = root.untag<internal_node *> ();
        EXPECT_EQ (root_internal->get_bitmap (), 0b10000000'10001010U);
        EXPECT_EQ (4U, pstore::bit_count::pop_count (root_internal->get_bitmap ()));
        this->check_is_leaf_node ((*root_internal)[3]);
        EXPECT_GT ((*root_internal)[3].to_address (), (*root_internal)[2].to_address ());
        index_->flush (t1, db_.get_current_revision ());
        this->check_is_store_internal_node (index_->root ());
        EXPECT_TRUE (this->is_found (*index_, "d")) << "key \"d\" should be present in the index";
    }
}